

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgclient.c
# Opt level: O1

int mg_session_begin_transaction(mg_session *session,mg_map *extra_run_information)

{
  int iVar1;
  int iVar2;
  char *fmt;
  mg_message *response;
  mg_message *local_20;
  
  if (session->version == 1) {
    mg_session_set_error(session,"Transaction are not supported in this version");
  }
  iVar1 = session->status;
  if (iVar1 == 1) {
    fmt = "Cannot start a transaction while a query is executing";
  }
  else if (iVar1 == 3) {
    fmt = "fetching result of a query";
  }
  else if (iVar1 == 2) {
    fmt = "bad session";
  }
  else {
    if (session->explicit_transaction == 0) {
      mg_message_destroy_ca((session->result).message,session->decoder_allocator);
      (session->result).message = (mg_message *)0x0;
      if (extra_run_information == (mg_map *)0x0) {
        extra_run_information = &mg_empty_map;
      }
      iVar1 = mg_session_send_begin_message(session,extra_run_information);
      if (((iVar1 == 0) && (iVar1 = mg_session_receive_message(session), iVar1 == 0)) &&
         (iVar1 = mg_session_read_bolt_message(session,&local_20), iVar1 == 0)) {
        if (local_20->type == MG_MESSAGE_TYPE_FAILURE) {
          iVar2 = handle_failure_message(session,(local_20->field_1).failure_v);
          iVar1 = handle_failure(session);
          if (iVar1 == 0) {
            mg_message_destroy_ca(local_20,session->decoder_allocator);
            return iVar2;
          }
        }
        else {
          if (local_20->type == MG_MESSAGE_TYPE_SUCCESS) {
            mg_message_destroy_ca(local_20,session->decoder_allocator);
            session->explicit_transaction = 1;
            session->query_number = 0;
            return 0;
          }
          mg_message_destroy_ca(local_20,session->decoder_allocator);
          mg_session_set_error(session,"unexpected message type");
          iVar1 = -10;
        }
      }
      mg_session_invalidate(session);
      return iVar1;
    }
    fmt = "Transaction already started";
  }
  mg_session_set_error(session,fmt);
  return -0xf;
}

Assistant:

int mg_session_begin_transaction(mg_session *session,
                                 const mg_map *extra_run_information) {
  if (session->version == 1) {
    mg_session_set_error(session,
                         "Transaction are not supported in this version");
  }
  if (session->status == MG_SESSION_BAD) {
    mg_session_set_error(session, "bad session");
    return MG_ERROR_BAD_CALL;
  }
  if (session->status == MG_SESSION_EXECUTING) {
    mg_session_set_error(
        session, "Cannot start a transaction while a query is executing");
    return MG_ERROR_BAD_CALL;
  }
  if (session->status == MG_SESSION_FETCHING) {
    mg_session_set_error(session, "fetching result of a query");
    return MG_ERROR_BAD_CALL;
  }
  if (session->explicit_transaction) {
    mg_session_set_error(session, "Transaction already started");
    return MG_ERROR_BAD_CALL;
  }
  assert(session->status == MG_SESSION_READY && !session->explicit_transaction);

  mg_message_destroy_ca(session->result.message, session->decoder_allocator);
  session->result.message = NULL;
  // TODO(aandelic): Check if the columns should be destroyed

  if (!extra_run_information) {
    extra_run_information = &mg_empty_map;
  }

  int status = 0;
  status = mg_session_send_begin_message(session, extra_run_information);
  if (status != 0) {
    goto fatal_failure;
  }

  status = mg_session_receive_message(session);
  if (status != 0) {
    goto fatal_failure;
  }

  mg_message *response;
  status = mg_session_read_bolt_message(session, &response);
  if (status != 0) {
    goto fatal_failure;
  }

  if (response->type == MG_MESSAGE_TYPE_SUCCESS) {
    mg_message_destroy_ca(response, session->decoder_allocator);
    session->explicit_transaction = 1;
    session->query_number = 0;
    return 0;
  }

  if (response->type == MG_MESSAGE_TYPE_FAILURE) {
    int failure_status = handle_failure_message(session, response->failure_v);

    status = handle_failure(session);
    if (status != 0) {
      goto fatal_failure;
    }

    mg_message_destroy_ca(response, session->decoder_allocator);
    return failure_status;
  }

  status = MG_ERROR_PROTOCOL_VIOLATION;
  mg_message_destroy_ca(response, session->decoder_allocator);
  mg_session_set_error(session, "unexpected message type");

fatal_failure:
  mg_session_invalidate(session);
  assert(status != 0);
  return status;
}